

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_class.h
# Opt level: O0

void dukglue_register_constructor<Rectangle,int,int,int,int>(duk_context *ctx,char *name)

{
  duk_c_function constructor_func;
  char *name_local;
  duk_context *ctx_local;
  
  duk_push_c_function(ctx,dukglue::detail::call_native_constructor<false,Rectangle,int,int,int,int>,
                      4);
  dukglue::detail::ProtoManager::push_prototype<Rectangle>(ctx);
  duk_put_prop_string(ctx,-2,"prototype");
  duk_put_global_string(ctx,name);
  return;
}

Assistant:

void dukglue_register_constructor(duk_context* ctx, const char* name)
{
	duk_c_function constructor_func = dukglue::detail::call_native_constructor<false, Cls, Ts...>;

	duk_push_c_function(ctx, constructor_func, sizeof...(Ts));

	// set constructor_func.prototype
	dukglue::detail::ProtoManager::push_prototype<Cls>(ctx);
	duk_put_prop_string(ctx, -2, "prototype");

	// set name = constructor_func
	duk_put_global_string(ctx, name);
}